

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void lj_asm_patchexit(jit_State *J,GCtrace *T,ExitNo exitno,MCode *target)

{
  MCode *pMVar1;
  uint32_t uVar2;
  MCode *ptr;
  byte *pbVar3;
  ulong uVar4;
  ushort *puVar5;
  ushort *ptr_00;
  ushort *puVar6;
  
  ptr_00 = (ushort *)T->mcode;
  ptr = lj_mcode_patch(J,(MCode *)ptr_00,0);
  uVar4 = (ulong)T->szmcode;
  pMVar1 = J->exitstubgroup[exitno >> 5];
  puVar6 = (ushort *)((long)ptr_00 + (uVar4 - 6));
  if (((5 < uVar4) && (*(byte *)((long)ptr_00 + (ulong)(T->szmcode - 5)) == 0xe9)) &&
     (pbVar3 = (byte *)(uVar4 + (long)ptr_00),
     (byte *)((long)*(int *)(pbVar3 + -4) + (long)puVar6) ==
     pMVar1 + (ulong)(exitno & 0x1f) * 4 + -6)) {
    *(int *)(pbVar3 + -4) = (int)target - (int)pbVar3;
  }
  for (; (ptr_00 < puVar6 &&
         ((uVar4 = (ulong)((*ptr_00 & 0xf0) == 0x40), *(int *)((long)ptr_00 + uVar4 + 2) != -0xec8
          || (*(byte *)((long)ptr_00 + uVar4) != 199))));
      ptr_00 = (ushort *)((long)ptr_00 + (ulong)uVar2)) {
    uVar2 = asm_x86_inslen((uint8_t *)ptr_00);
  }
  puVar5 = (ushort *)0x0;
  for (; ptr_00 < puVar6; ptr_00 = (ushort *)((long)ptr_00 + (ulong)uVar2)) {
    if ((((*ptr_00 & 0xf0ff) == 0x800f) &&
        ((byte *)((long)*(int *)(ptr_00 + 1) + (long)ptr_00) ==
         pMVar1 + (ulong)(exitno & 0x1f) * 4 + -6)) && (ptr_00 != puVar5)) {
      *(int *)(ptr_00 + 1) = ((int)target - (int)ptr_00) + -6;
    }
    else if (((char)*ptr_00 == -0x18) &&
            ((byte *)((long)*(int *)((long)ptr_00 + 1) + (long)ptr_00) == (byte *)0x11451e)) {
      puVar5 = (ushort *)((long)ptr_00 + 7);
    }
    uVar2 = asm_x86_inslen((uint8_t *)ptr_00);
  }
  lj_mcode_sync(T->mcode,T->mcode + T->szmcode);
  lj_mcode_patch(J,ptr,1);
  return;
}

Assistant:

void lj_asm_patchexit(jit_State *J, GCtrace *T, ExitNo exitno, MCode *target)
{
  MCode *p = T->mcode;
  MCode *mcarea = lj_mcode_patch(J, p, 0);
  MSize len = T->szmcode;
  MCode *px = exitstub_addr(J, exitno) - 6;
  MCode *pe = p+len-6;
  MCode *pgc = NULL;
#if LJ_GC64
  uint32_t statei = (uint32_t)(GG_OFS(g.vmstate) - GG_OFS(dispatch));
#else
  uint32_t statei = u32ptr(&J2G(J)->vmstate);
#endif
  if (len > 5 && p[len-5] == XI_JMP && p+len-6 + *(int32_t *)(p+len-4) == px)
    *(int32_t *)(p+len-4) = jmprel(J, p+len, target);
  /* Do not patch parent exit for a stack check. Skip beyond vmstate update. */
  for (; p < pe; p += asm_x86_inslen(p)) {
    intptr_t ofs = LJ_GC64 ? (p[0] & 0xf0) == 0x40 : LJ_64;
    if (*(uint32_t *)(p+2+ofs) == statei && p[ofs+LJ_GC64-LJ_64] == XI_MOVmi)
      break;
  }
  lj_assertJ(p < pe, "instruction length decoder failed");
  for (; p < pe; p += asm_x86_inslen(p)) {
    if ((*(uint16_t *)p & 0xf0ff) == 0x800f && p + *(int32_t *)(p+2) == px &&
	p != pgc) {
      *(int32_t *)(p+2) = jmprel(J, p+6, target);
    } else if (*p == XI_CALL &&
	      (void *)(p+5+*(int32_t *)(p+1)) == (void *)lj_gc_step_jit) {
      pgc = p+7;  /* Do not patch GC check exit. */
    }
  }
  lj_mcode_sync(T->mcode, T->mcode + T->szmcode);
  lj_mcode_patch(J, mcarea, 1);
}